

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpf_common_sse2.h
# Opt level: O0

void transpose16x8_8x16_sse2
               (__m128i *x0,__m128i *x1,__m128i *x2,__m128i *x3,__m128i *x4,__m128i *x5,__m128i *x6,
               __m128i *x7,__m128i *x8,__m128i *x9,__m128i *x10,__m128i *x11,__m128i *x12,
               __m128i *x13,__m128i *x14,__m128i *x15,__m128i *d0,__m128i *d1,__m128i *d2,
               __m128i *d3,__m128i *d4,__m128i *d5,__m128i *d6,__m128i *d7)

{
  __m128i alVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 (*in_RCX) [16];
  undefined1 (*in_RDX) [16];
  undefined1 (*in_RSI) [16];
  undefined1 (*in_RDI) [16];
  undefined1 (*in_R8) [16];
  undefined1 (*in_R9) [16];
  __m128i w7;
  __m128i w6;
  __m128i w5;
  __m128i w4;
  __m128i w3;
  __m128i w2;
  __m128i w1;
  __m128i w0;
  __m128i w15;
  __m128i w14;
  __m128i w13;
  __m128i w12;
  __m128i w11;
  __m128i w10;
  __m128i w9;
  __m128i w8;
  
  auVar2 = vpunpcklbw_avx(*in_RDI,*in_RSI);
  auVar3 = vpunpcklbw_avx(*in_RDX,*in_RCX);
  auVar4 = vpunpcklbw_avx(*in_R8,*in_R9);
  auVar5 = vpunpcklbw_avx(*(undefined1 (*) [16])w7[1],*(undefined1 (*) [16])w6[0]);
  auVar6 = vpunpcklbw_avx(*(undefined1 (*) [16])w6[1],*(undefined1 (*) [16])w5[0]);
  auVar7 = vpunpcklbw_avx(*(undefined1 (*) [16])w5[1],*(undefined1 (*) [16])w4[0]);
  auVar8 = vpunpcklbw_avx(*(undefined1 (*) [16])w4[1],*(undefined1 (*) [16])w3[0]);
  auVar9 = vpunpcklbw_avx(*(undefined1 (*) [16])w3[1],*(undefined1 (*) [16])w2[0]);
  auVar10 = vpunpcklwd_avx(auVar2,auVar3);
  auVar11 = vpunpcklwd_avx(auVar4,auVar5);
  auVar12 = vpunpcklwd_avx(auVar6,auVar7);
  auVar13 = vpunpcklwd_avx(auVar8,auVar9);
  auVar14 = vpunpckldq_avx(auVar10,auVar11);
  auVar10 = vpunpckhdq_avx(auVar10,auVar11);
  auVar15 = vpunpckldq_avx(auVar12,auVar13);
  auVar11 = vpunpckhdq_avx(auVar12,auVar13);
  auVar12 = vpunpcklqdq_avx(auVar14,auVar15);
  *(undefined1 (*) [16])w2[1] = auVar12;
  auVar12 = vpunpckhqdq_avx(auVar14,auVar15);
  *(undefined1 (*) [16])w1[0] = auVar12;
  auVar12 = vpunpcklqdq_avx(auVar10,auVar11);
  *(undefined1 (*) [16])w1[1] = auVar12;
  auVar10 = vpunpckhqdq_avx(auVar10,auVar11);
  *(undefined1 (*) [16])w0[0] = auVar10;
  auVar10 = vpunpckhwd_avx(auVar2,auVar3);
  auVar11 = vpunpckhwd_avx(auVar4,auVar5);
  auVar12 = vpunpckhwd_avx(auVar6,auVar7);
  auVar2 = vpunpckhwd_avx(auVar8,auVar9);
  auVar3 = vpunpckldq_avx(auVar10,auVar11);
  auVar10 = vpunpckhdq_avx(auVar10,auVar11);
  auVar4 = vpunpckldq_avx(auVar12,auVar2);
  auVar11 = vpunpckhdq_avx(auVar12,auVar2);
  auVar12 = vpunpcklqdq_avx(auVar3,auVar4);
  *(undefined1 (*) [16])w0[1] = auVar12;
  alVar1 = (__m128i)vpunpckhqdq_avx(auVar3,auVar4);
  *x5 = alVar1;
  alVar1 = (__m128i)vpunpcklqdq_avx(auVar10,auVar11);
  *x4 = alVar1;
  alVar1 = (__m128i)vpunpckhqdq_avx(auVar10,auVar11);
  *x3 = alVar1;
  return;
}

Assistant:

static inline void transpose16x8_8x16_sse2(
    __m128i *x0, __m128i *x1, __m128i *x2, __m128i *x3, __m128i *x4,
    __m128i *x5, __m128i *x6, __m128i *x7, __m128i *x8, __m128i *x9,
    __m128i *x10, __m128i *x11, __m128i *x12, __m128i *x13, __m128i *x14,
    __m128i *x15, __m128i *d0, __m128i *d1, __m128i *d2, __m128i *d3,
    __m128i *d4, __m128i *d5, __m128i *d6, __m128i *d7) {
  __m128i w0, w1, w2, w3, w4, w5, w6, w7, w8, w9;
  __m128i w10, w11, w12, w13, w14, w15;

  w0 = _mm_unpacklo_epi8(*x0, *x1);
  w1 = _mm_unpacklo_epi8(*x2, *x3);
  w2 = _mm_unpacklo_epi8(*x4, *x5);
  w3 = _mm_unpacklo_epi8(*x6, *x7);

  w8 = _mm_unpacklo_epi8(*x8, *x9);
  w9 = _mm_unpacklo_epi8(*x10, *x11);
  w10 = _mm_unpacklo_epi8(*x12, *x13);
  w11 = _mm_unpacklo_epi8(*x14, *x15);

  w4 = _mm_unpacklo_epi16(w0, w1);
  w5 = _mm_unpacklo_epi16(w2, w3);
  w12 = _mm_unpacklo_epi16(w8, w9);
  w13 = _mm_unpacklo_epi16(w10, w11);

  w6 = _mm_unpacklo_epi32(w4, w5);
  w7 = _mm_unpackhi_epi32(w4, w5);
  w14 = _mm_unpacklo_epi32(w12, w13);
  w15 = _mm_unpackhi_epi32(w12, w13);

  // Store first 4-line result
  *d0 = _mm_unpacklo_epi64(w6, w14);
  *d1 = _mm_unpackhi_epi64(w6, w14);
  *d2 = _mm_unpacklo_epi64(w7, w15);
  *d3 = _mm_unpackhi_epi64(w7, w15);

  w4 = _mm_unpackhi_epi16(w0, w1);
  w5 = _mm_unpackhi_epi16(w2, w3);
  w12 = _mm_unpackhi_epi16(w8, w9);
  w13 = _mm_unpackhi_epi16(w10, w11);

  w6 = _mm_unpacklo_epi32(w4, w5);
  w7 = _mm_unpackhi_epi32(w4, w5);
  w14 = _mm_unpacklo_epi32(w12, w13);
  w15 = _mm_unpackhi_epi32(w12, w13);

  // Store second 4-line result
  *d4 = _mm_unpacklo_epi64(w6, w14);
  *d5 = _mm_unpackhi_epi64(w6, w14);
  *d6 = _mm_unpacklo_epi64(w7, w15);
  *d7 = _mm_unpackhi_epi64(w7, w15);
}